

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatPrinter_p.cpp
# Opt level: O3

string * __thiscall
BamTools::Internal::SamFormatPrinter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SamFormatPrinter *this)

{
  stringstream out;
  stringstream local_1a0 [128];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintHD(this,(stringstream *)local_1a0);
  PrintSQ(this,(stringstream *)local_1a0);
  PrintRG(this,(stringstream *)local_1a0);
  PrintPG(this,(stringstream *)local_1a0);
  PrintCO(this,(stringstream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string SamFormatPrinter::ToString() const
{

    // clear out stream
    std::stringstream out;

    // generate formatted header text
    PrintHD(out);
    PrintSQ(out);
    PrintRG(out);
    PrintPG(out);
    PrintCO(out);

    // return result
    return out.str();
}